

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.c
# Opt level: O1

void xmlParserPrintFileContextInternal
               (xmlParserInputPtr input,xmlGenericErrorFunc channel,void *data)

{
  byte *pbVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  byte *pbVar5;
  uint uVar6;
  byte *pbVar7;
  byte *__src;
  int *len;
  bool bVar8;
  xmlChar content [81];
  int local_88 [22];
  
  if ((input != (xmlParserInputPtr)0x0) && (pbVar1 = input->cur, pbVar1 != (byte *)0x0)) {
    pbVar5 = input->base;
    __src = pbVar1;
    for (pbVar7 = pbVar1; (pbVar5 < pbVar7 && ((*pbVar7 == 0xd || (__src = pbVar7, *pbVar7 == 10))))
        ; pbVar7 = pbVar7 + -1) {
      __src = pbVar5;
    }
    bVar8 = true;
    if (pbVar5 < __src) {
      uVar3 = 0;
      while ((uVar6 = uVar3, *__src != 10 && (*__src != 0xd))) {
        __src = __src + -1;
        uVar6 = 1;
        if ((0x4e < uVar3) || (uVar3 = uVar3 + 1, __src <= pbVar5)) break;
      }
      bVar8 = uVar6 == 0;
    }
    if ((!bVar8) && ((*__src == 0xd || (*__src == 10)))) {
      __src = __src + 1;
    }
    uVar3 = 0;
    len = local_88;
    pbVar5 = __src;
    do {
      if ((*pbVar5 < 0xe) && ((0x2401U >> (*pbVar5 & 0x1f) & 1) != 0)) break;
      local_88[0] = *(int *)&input->end - (int)pbVar5;
      iVar2 = xmlGetUTF8Char(pbVar5,len);
      if (iVar2 < 0) {
LAB_0012e300:
        bVar8 = false;
      }
      else {
        if (0x50 < local_88[0] + uVar3) goto LAB_0012e300;
        pbVar5 = pbVar5 + local_88[0];
        bVar8 = true;
        uVar3 = local_88[0] + uVar3;
      }
    } while (bVar8);
    memcpy(len,__src,(ulong)uVar3);
    *(undefined1 *)((long)local_88 + (ulong)uVar3) = 0;
    (*channel)(data,"%s\n",len);
    if ((int)pbVar1 != (int)__src) {
      len = local_88;
      lVar4 = 0;
      do {
        if ((int)lVar4 == 0x4f) goto LAB_0012e379;
        if (*(char *)((long)local_88 + lVar4) != '\t') {
          if (*(char *)((long)local_88 + lVar4) == '\0') break;
          *(undefined1 *)((long)local_88 + lVar4) = 0x20;
        }
        len = (int *)((long)len + 1);
        lVar4 = lVar4 + 1;
      } while ((int)pbVar1 - (int)__src != (int)lVar4);
      len = (int *)((long)local_88 + lVar4);
    }
LAB_0012e379:
    *(undefined2 *)len = 0x5e;
    (*channel)(data,"%s\n",local_88);
  }
  return;
}

Assistant:

static void
xmlParserPrintFileContextInternal(xmlParserInputPtr input ,
		xmlGenericErrorFunc channel, void *data ) {
    const xmlChar *cur, *base, *start;
    unsigned int n, col;	/* GCC warns if signed, because compared with sizeof() */
    xmlChar  content[81]; /* space for 80 chars + line terminator */
    xmlChar *ctnt;

    if ((input == NULL) || (input->cur == NULL))
        return;

    cur = input->cur;
    base = input->base;
    /* skip backwards over any end-of-lines */
    while ((cur > base) && ((*(cur) == '\n') || (*(cur) == '\r'))) {
	cur--;
    }
    n = 0;
    /* search backwards for beginning-of-line (to max buff size) */
    while ((n < sizeof(content) - 1) && (cur > base) &&
	   (*cur != '\n') && (*cur != '\r')) {
        cur--;
        n++;
    }
    if ((n > 0) && ((*cur == '\n') || (*cur == '\r'))) {
        cur++;
    } else {
        /* skip over continuation bytes */
        while ((cur < input->cur) && ((*cur & 0xC0) == 0x80))
            cur++;
    }
    /* calculate the error position in terms of the current position */
    col = input->cur - cur;
    /* search forward for end-of-line (to max buff size) */
    n = 0;
    start = cur;
    /* copy selected text to our buffer */
    while ((*cur != 0) && (*(cur) != '\n') && (*(cur) != '\r')) {
        int len = input->end - cur;
        int c = xmlGetUTF8Char(cur, &len);

        if ((c < 0) || (n + len > sizeof(content)-1))
            break;
        cur += len;
	n += len;
    }
    memcpy(content, start, n);
    content[n] = 0;
    /* print out the selected text */
    channel(data ,"%s\n", content);
    /* create blank line with problem pointer */
    n = 0;
    ctnt = content;
    /* (leave buffer space for pointer + line terminator) */
    while ((n<col) && (n++ < sizeof(content)-2) && (*ctnt != 0)) {
	if (*(ctnt) != '\t')
	    *(ctnt) = ' ';
	ctnt++;
    }
    *ctnt++ = '^';
    *ctnt = 0;
    channel(data ,"%s\n", content);
}